

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# representation.cpp
# Opt level: O3

bool MakeAMove(Situation *situation,Movement *move,bool isbegin)

{
  pointer *ppMVar1;
  byte bVar2;
  byte bVar3;
  pointer pMVar4;
  bool bVar5;
  UINT8 UVar6;
  undefined2 uVar7;
  UINT8 UVar8;
  undefined1 uVar9;
  UINT32 UVar10;
  byte bVar11;
  int iVar12;
  ulong uVar13;
  long lVar14;
  UINT8 *pUVar15;
  iterator __position;
  ulong uVar16;
  byte bVar17;
  bool bVar18;
  bool bVar19;
  
  bVar17 = move->from;
  bVar11 = situation->current_board[bVar17];
  bVar2 = move->to;
  bVar3 = situation->current_board[bVar2];
  uVar13 = (ulong)bVar3;
  uVar16 = ZobristKey ^ ZobristPlayer ^ ZobristTable[bVar11][bVar17];
  if (uVar13 != 0) {
    uVar16 = uVar16 ^ ZobristTable[bVar3][bVar2];
  }
  ZobristKey = uVar16 ^ ZobristTable[bVar11][bVar2];
  uVar16 = ZobristKeyCheck ^ ZobristPlayerCheck ^ ZobristTableCheck[bVar11][bVar17];
  if (uVar13 != 0) {
    uVar16 = uVar16 ^ ZobristTableCheck[bVar3][bVar2];
  }
  ZobristKeyCheck = uVar16 ^ ZobristTableCheck[situation->current_board[bVar17]][bVar2];
  iVar12 = PIECE_NUM_TO_TYPE[bVar11];
  situation->value[situation->current_player] =
       situation->value[situation->current_player] -
       PiecesValue[situation->current_player][iVar12][bVar17];
  situation->value[situation->current_player] =
       situation->value[situation->current_player] +
       PiecesValue[situation->current_player][iVar12][bVar2];
  if (uVar13 == 0) {
    situation->bit_row[bVar17 >> 4] =
         situation->bit_row[bVar17 >> 4] ^
         *(ushort *)((long)BIT_ROW_MASK + (ulong)((uint)bVar17 + (uint)bVar17));
    situation->bit_col[bVar17 & 0xf] =
         situation->bit_col[bVar17 & 0xf] ^
         *(ushort *)((long)BIT_COL_MASK + (ulong)((uint)bVar17 + (uint)bVar17));
    situation->bit_row[bVar2 >> 4] =
         situation->bit_row[bVar2 >> 4] ^
         *(ushort *)((long)BIT_ROW_MASK + (ulong)((uint)bVar2 + (uint)bVar2));
    situation->bit_col[bVar2 & 0xf] =
         situation->bit_col[bVar2 & 0xf] ^
         *(ushort *)((long)BIT_COL_MASK + (ulong)((uint)bVar2 + (uint)bVar2));
    situation->current_board[bVar17] = '\0';
    situation->current_board[move->to] = bVar11;
    situation->current_pieces[bVar11] = move->to;
  }
  else {
    bVar18 = (bVar3 & 0x10) == 0;
    situation->value[bVar18] =
         situation->value[bVar18] - PiecesValue[bVar18][PIECE_NUM_TO_TYPE[uVar13]][bVar2];
    situation->bit_row[bVar17 >> 4] =
         situation->bit_row[bVar17 >> 4] ^
         *(ushort *)((long)BIT_ROW_MASK + (ulong)((uint)bVar17 + (uint)bVar17));
    situation->bit_col[bVar17 & 0xf] =
         situation->bit_col[bVar17 & 0xf] ^
         *(ushort *)((long)BIT_COL_MASK + (ulong)((uint)bVar17 + (uint)bVar17));
    situation->current_board[bVar17] = '\0';
    situation->current_board[move->to] = bVar11;
    situation->current_pieces[bVar11] = move->to;
    situation->current_pieces[uVar13] = '\0';
  }
  if (isbegin) {
    iVar12 = Catch(situation,move);
    bVar17 = (byte)iVar12;
    move->catc = bVar17;
    move->movec = bVar11;
    bVar5 = true;
    if (bVar17 == 0) {
      iVar12 = CheckOpponent(situation);
      if (iVar12 == 0) {
        bVar5 = false;
      }
      else {
        bVar17 = (char)situation->current_player * -0x10 + 0x20;
        move->catc = bVar17;
        bVar11 = (byte)iVar12;
        move->movec = bVar11;
      }
    }
    pMVar4 = (situation->moves_stack).super__Vector_base<Movement,_std::allocator<Movement>_>.
             _M_impl.super__Vector_impl_data._M_start;
    __position._M_current =
         (situation->moves_stack).super__Vector_base<Movement,_std::allocator<Movement>_>._M_impl.
         super__Vector_impl_data._M_finish;
    uVar13 = ((long)__position._M_current - (long)pMVar4 >> 2) * -0x5555555555555555;
    bVar19 = true;
    bVar18 = bVar5;
    if ((5 < uVar13) && (bVar17 != 0)) {
      lVar14 = (long)((int)uVar13 + -1);
      pUVar15 = &pMVar4[lVar14 + -1].movec;
      uVar13 = 0xffffffffffffffff;
      do {
        bVar18 = false;
        if ((pUVar15[-1] != bVar17) || (bVar18 = false, *pUVar15 != bVar11)) break;
        uVar13 = uVar13 + 2;
        pUVar15 = pUVar15 + -0x18;
        bVar18 = bVar5;
      } while (uVar13 < 4);
      bVar19 = pMVar4[lVar14].catc != '\0';
      if ((bVar18) && (pMVar4[lVar14].movec != '\0')) {
        pUVar15 = &pMVar4[lVar14 + -2].movec;
        uVar13 = 0;
        do {
          bVar18 = true;
          if ((pUVar15[-1] != pMVar4[lVar14].catc) || (*pUVar15 != pMVar4[lVar14].movec)) {
            bVar19 = false;
            break;
          }
          uVar13 = uVar13 + 2;
          pUVar15 = pUVar15 + -0x18;
        } while (uVar13 < 3);
      }
    }
  }
  else {
    __position._M_current =
         (situation->moves_stack).super__Vector_base<Movement,_std::allocator<Movement>_>._M_impl.
         super__Vector_impl_data._M_finish;
    bVar19 = true;
    bVar18 = true;
  }
  if (__position._M_current ==
      (situation->moves_stack).super__Vector_base<Movement,_std::allocator<Movement>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<Movement,std::allocator<Movement>>::_M_realloc_insert<Movement_const&>
              ((vector<Movement,std::allocator<Movement>> *)&situation->moves_stack,__position,move)
    ;
  }
  else {
    UVar6 = move->movec;
    uVar7 = *(undefined2 *)&move->field_0xa;
    (__position._M_current)->catc = move->catc;
    (__position._M_current)->movec = UVar6;
    *(undefined2 *)&(__position._M_current)->field_0xa = uVar7;
    UVar6 = move->to;
    UVar8 = move->capture;
    uVar9 = move->field_0x3;
    UVar10 = move->value;
    (__position._M_current)->from = move->from;
    (__position._M_current)->to = UVar6;
    (__position._M_current)->capture = UVar8;
    (__position._M_current)->field_0x3 = uVar9;
    (__position._M_current)->value = UVar10;
    ppMVar1 = &(situation->moves_stack).super__Vector_base<Movement,_std::allocator<Movement>_>.
               _M_impl.super__Vector_impl_data._M_finish;
    *ppMVar1 = *ppMVar1 + 1;
  }
  step = step + 1;
  if ((!bVar19 && isbegin) && bVar18) {
    situation->current_player = 1 - situation->current_player;
  }
  else {
    bVar18 = BeChecked(situation);
    situation->current_player = 1 - situation->current_player;
    if (!bVar18) {
      bVar18 = KingFacing(situation);
      return bVar18;
    }
  }
  return true;
}

Assistant:

bool MakeAMove(Situation & situation,Movement & move, bool isbegin){

    int piece_id_from = situation.current_board[move.from];
    int piece_id_to = situation.current_board[move.to];

    

    // 1. 置换表更新
    // 1.1 当前局面哈希值
    ZobristKey ^= ZobristPlayer;
    ZobristKey ^= ZobristTable[piece_id_from][move.from];
    if(piece_id_to != 0)
        ZobristKey ^= ZobristTable[piece_id_to][move.to];
    ZobristKey ^= ZobristTable[piece_id_from][move.to];

    //  1.2 当前局面哈希校验值
    ZobristKeyCheck ^= ZobristPlayerCheck;
    ZobristKeyCheck ^= ZobristTableCheck[piece_id_from][move.from];
    if(piece_id_to != 0)
        ZobristKeyCheck ^= ZobristTableCheck[piece_id_to][move.to];
    ZobristKeyCheck ^= ZobristTableCheck[situation.current_board[move.from]][move.to];

    // 2. 更新子力价值
    situation.value[situation.current_player] -= PiecesValue[situation.current_player][PIECE_NUM_TO_TYPE[piece_id_from]][move.from];
    situation.value[situation.current_player] += PiecesValue[situation.current_player][PIECE_NUM_TO_TYPE[piece_id_from]][move.to];

    // 3. 移动棋子
    // 4.1 如果是吃子着法
    if(piece_id_to != 0){
        // 4.1.1 更新子力价值
        situation.value[ColorOfPiece(piece_id_to)] -= PiecesValue[ColorOfPiece(piece_id_to)][PIECE_NUM_TO_TYPE[piece_id_to]][move.to];
        // 4.1.2 只更新起始格的位行位列
        int row = GetRow(move.from), col = GetCol(move.from);
        situation.bit_row[row] ^= BIT_ROW_MASK[move.from];
        situation.bit_col[col] ^= BIT_COL_MASK[move.from];
        // 4.1.3 更新棋子棋盘数组
        situation.current_board[move.from] = 0;
        situation.current_board[move.to] = piece_id_from;
        situation.current_pieces[piece_id_from] = move.to;
        situation.current_pieces[piece_id_to] = 0;
    }else{
        // 4.1.1 更新起始格的位行位列
        int row = GetRow(move.from), col = GetCol(move.from);
        situation.bit_row[row] ^= BIT_ROW_MASK[move.from];
        situation.bit_col[col] ^= BIT_COL_MASK[move.from];
        // 4.1.2 更新目标格的位行位列
        row = GetRow(move.to), col = GetCol(move.to);
        situation.bit_row[row] ^= BIT_ROW_MASK[move.to];
        situation.bit_col[col] ^= BIT_COL_MASK[move.to];
        // 4.1.3 更新棋子棋盘数组
        situation.current_board[move.from] = 0;
        situation.current_board[move.to] = piece_id_from;
        situation.current_pieces[piece_id_from] = move.to;
    
    }

    // 4. 如果是开始转换局面或者试探局面，则需要判断该着法是否抓子，抓的是哪个子
    int longcatme = 1, longcatopp = 1;
    if(isbegin){
        move.catc = Catch(situation, move);
        move.movec = piece_id_from;
        if(move.catc == 0){
            int check = CheckOpponent(situation);
            if(check){
                move.catc = GetPlayerFlag(OpponentPlayer(situation.current_player)) + 0;
                move.movec = check;
            }else longcatme = 0;
        }
        // 判断自己是否已经走了6步同一子a捉同一子b
        if(situation.moves_stack.size() >= 6 && move.catc){
            int last_index = situation.moves_stack.size() - 1;
            for(int i = 1; i <= 5; i += 2){
                if(!(situation.moves_stack[last_index - i].catc == move.catc && situation.moves_stack[last_index - i].movec == move.movec)){
                    longcatme = 0;
                    break;
                }
            }
            // 如果自己长抓，判断对方是否也长抓
            int movec = situation.moves_stack[last_index].movec;
            int catc = situation.moves_stack[last_index].catc;
            if(catc == 0) longcatopp = 0;
            if(longcatme && movec){
                for(int i = 2; i <= 4; i += 2){
                    if(!(situation.moves_stack[last_index - i].catc == catc && situation.moves_stack[last_index - i].movec == movec)){
                        longcatopp = 0;
                        break;
                    }
                }
            }
        }
    }

    // 5. 放入走法栈
    situation.moves_stack.push_back(move);
    step++;

    // 自己长抓，对方没长抓，则返回true
    if(isbegin && longcatme && !longcatopp){
        ChangePlayer(situation.current_player);
        return true;
    }

    // 6. 交换走棋方
    if(BeChecked(situation)){
        ChangePlayer(situation.current_player);
        return true;
    }
    ChangePlayer(situation.current_player);
    return KingFacing(situation);
}